

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::expand<long>(Omega_h *this,Read<signed_char> *a_data,LOs *a2b,Int width)

{
  int iVar1;
  void *extraout_RDX;
  Read<signed_char> RVar2;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_e9;
  Write<signed_char> b_data;
  Write<int> local_c8;
  Write<int> local_b8;
  Write<int> local_a8;
  Write<int> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_e9);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b_data,
                 &local_68,":");
  std::__cxx11::to_string(&local_48,0x7b);
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b_data,
                 &local_48);
  begin_code("expand",local_88._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&b_data);
  std::__cxx11::string::~string((string *)&local_68);
  iVar1 = Read<int>::last((Read<signed_char> *)a2b);
  std::__cxx11::string::string((string *)&local_88,"",(allocator *)&local_68);
  Write<long>::Write((Write<long> *)&b_data,iVar1 * width,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  Write<long>::Write(&local_98,(Write<int> *)a_data);
  Write<int>::Write(&local_a8,&a2b->write_);
  Write<long>::Write(&local_b8,(Write<int> *)&b_data);
  expand_into<long>((Read<signed_char> *)&local_98,(LOs *)&local_a8,(Write<signed_char> *)&local_b8,
                    width);
  Write<long>::~Write((Write<long> *)&local_b8);
  Write<int>::~Write(&local_a8);
  Write<long>::~Write((Write<long> *)&local_98);
  Write<long>::Write(&local_c8,(Write<int> *)&b_data);
  Read<long>::Read((Read<signed_char> *)this,(Write<long> *)&local_c8);
  Write<long>::~Write((Write<long> *)&local_c8);
  Write<long>::~Write((Write<long> *)&b_data);
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<T> expand(Read<T> a_data, LOs a2b, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto nb = a2b.last();
  Write<T> b_data(nb * width);
  expand_into(a_data, a2b, b_data, width);
  return b_data;
}